

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O0

bool __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::haveConflictingRelation
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *lt,Type type,Bucket *rt,
          Relations *maybeBetween)

{
  bool bVar1;
  undefined8 in_RCX;
  uint in_EDX;
  RelationsGraph<dg::vr::ValueRelations> *in_RSI;
  Bucket *in_RDI;
  Bucket *in_R8;
  Relations between;
  undefined8 in_stack_ffffffffffffffa8;
  Type type_00;
  uint7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined4 in_stack_ffffffffffffffc0;
  RelationsGraph<dg::vr::ValueRelations> *in_stack_ffffffffffffffc8;
  Type type_01;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  type_01 = (Type)((ulong)in_RCX >> 0x20);
  if (in_EDX < 10) {
    fromMaybeBetween(in_stack_ffffffffffffffc8,(Bucket *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0),
                     in_RDI,(Relations *)
                            CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    local_1 = Relations::conflictsWith
                        ((Relations *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0),
                         (Type)((ulong)in_RDI >> 0x20));
  }
  else if (in_EDX == 10) {
    type_00 = (Type)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    bVar1 = Bucket::hasRelation((Bucket *)
                                CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                                type_00);
    local_1 = false;
    if (bVar1) {
      Bucket::getRelated((Bucket *)(ulong)in_stack_ffffffffffffffb0,type_00);
      local_1 = haveConflictingRelation
                          (in_RSI,(Bucket *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),type_01,in_R8
                           ,(Relations *)in_stack_ffffffffffffffc8);
    }
  }
  else {
    if (in_EDX != 0xb) {
      abort();
    }
    dg::vr::Relations::inverted(PF);
    local_1 = haveConflictingRelation
                        (in_RSI,(Bucket *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),type_01,in_R8,
                         (Relations *)in_stack_ffffffffffffffc8);
  }
  return local_1;
}

Assistant:

bool haveConflictingRelation(const Bucket &lt, Relations::Type type,
                                 const Bucket &rt,
                                 Relations *maybeBetween = nullptr) const {
        switch (type) {
        case Relations::EQ:
        case Relations::NE:
        case Relations::SLT:
        case Relations::SLE:
        case Relations::ULT:
        case Relations::ULE:
        case Relations::SGT:
        case Relations::SGE:
        case Relations::UGT:
        case Relations::UGE: {
            Relations between = fromMaybeBetween(lt, rt, maybeBetween);
            return between.conflictsWith(type);
        }
        case Relations::PT:
            return lt.hasRelation(type) &&
                   haveConflictingRelation(lt.getRelated(type), Relations::EQ,
                                           rt);
        case Relations::PF:
            return haveConflictingRelation(rt, Relations::inverted(type), lt);
        }
        assert(0 && "unreachable");
        abort();
    }